

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

float mpack_node_float_strict(mpack_node_t node)

{
  if ((node.tree)->error != mpack_ok) {
    return 0.0;
  }
  if ((node.data)->type == mpack_type_float) {
    return ((node.data)->value).f;
  }
  mpack_tree_flag_error(node.tree,mpack_error_type);
  return 0.0;
}

Assistant:

MPACK_INLINE float mpack_node_float_strict(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_float)
        return node.data->value.f;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}